

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_io_write(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  TRef TVar4;
  TRef TVar5;
  TRef TVar6;
  long lVar7;
  ptrdiff_t pVar8;
  long in_RSI;
  jit_State *in_RDI;
  TRef tr_1;
  TRef tr;
  IRIns *irs;
  TRef len;
  TRef buf;
  TRef str;
  ptrdiff_t i;
  TRef one;
  TRef zero;
  TRef fp;
  TRef ud;
  jit_State *in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff60;
  IRRef1 in_stack_ffffffffffffff62;
  uint in_stack_ffffffffffffff64;
  TRef in_stack_ffffffffffffff68;
  TRef in_stack_ffffffffffffff6c;
  jit_State *in_stack_ffffffffffffff70;
  IRIns *J_00;
  int32_t in_stack_ffffffffffffff84;
  TRef *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  TVar1 = recff_io_fp((jit_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  TVar2 = lj_ir_kint(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  TVar3 = lj_ir_kint(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  for (lVar7 = (long)(int)(uint)(*(int *)(in_RSI + 0x10) == 0); in_RDI->base[lVar7] != 0;
      lVar7 = lVar7 + 1) {
    TVar4 = lj_ir_tostr((jit_State *)
                        CONCAT44(in_stack_ffffffffffffff64,
                                 CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)),
                        (TRef)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    (in_RDI->fold).ins.field_0.ot = 0x3f05;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar5 = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    (in_RDI->fold).ins.field_0.ot = 0x4413;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (in_RDI->fold).ins.field_0.op2 = 0;
    TVar6 = lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (((TVar6 & 0xffff) < 0x8000) && ((in_RDI->cur).ir[TVar6 & 0xffff].field_1.op12 == 1)) {
      J_00 = (in_RDI->cur).ir + (TVar4 & 0xffff);
      if (((J_00->field_1).o == '[') && ((J_00->field_0).op2 == 2)) {
        in_stack_ffffffffffffff64 = (uint)(J_00->field_0).op1;
      }
      else {
        (in_RDI->fold).ins.field_0.ot = 0x4510;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (in_RDI->fold).ins.field_0.op2 = 1;
        in_stack_ffffffffffffff64 =
             lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
        ;
      }
      in_stack_ffffffffffffff6c =
           lj_ir_call(in_RDI,IRCALL_fputc,(ulong)in_stack_ffffffffffffff64,(ulong)TVar1);
      pVar8 = results_wanted(in_RDI);
      if (pVar8 != 0) {
        in_stack_ffffffffffffff62 = (IRRef1)in_stack_ffffffffffffff6c;
        in_stack_ffffffffffffff58 = in_RDI;
        TVar4 = lj_ir_kint((jit_State *)&J_00->field_0,in_stack_ffffffffffffff6c);
        (in_stack_ffffffffffffff58->fold).ins.field_0.ot = 0x993;
        (in_stack_ffffffffffffff58->fold).ins.field_0.op1 = in_stack_ffffffffffffff62;
        (in_stack_ffffffffffffff58->fold).ins.field_0.op2 = (IRRef1)TVar4;
        lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
    }
    else {
      in_stack_ffffffffffffff68 =
           lj_ir_call(in_RDI,IRCALL_fwrite,(ulong)TVar5,(ulong)TVar3,(ulong)TVar6,(ulong)TVar1);
      pVar8 = results_wanted(in_RDI);
      if (pVar8 != 0) {
        (in_RDI->fold).ins.field_0.ot = 0x893;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_stack_ffffffffffffff68;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar6;
        lj_opt_fold((jit_State *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      }
    }
  }
  *in_RDI->base = 0x2007ffd;
  return;
}

Assistant:

static void LJ_FASTCALL recff_io_write(jit_State *J, RecordFFData *rd)
{
  TRef ud, fp = recff_io_fp(J, &ud, rd->data);
  TRef zero = lj_ir_kint(J, 0);
  TRef one = lj_ir_kint(J, 1);
  ptrdiff_t i = rd->data == 0 ? 1 : 0;
  for (; J->base[i]; i++) {
    TRef str = lj_ir_tostr(J, J->base[i]);
    TRef buf = emitir(IRT(IR_STRREF, IRT_PGC), str, zero);
    TRef len = emitir(IRTI(IR_FLOAD), str, IRFL_STR_LEN);
    if (tref_isk(len) && IR(tref_ref(len))->i == 1) {
      IRIns *irs = IR(tref_ref(str));
      TRef tr = (irs->o == IR_TOSTR && irs->op2 == IRTOSTR_CHAR) ?
		irs->op1 :
		emitir(IRT(IR_XLOAD, IRT_U8), buf, IRXLOAD_READONLY);
      tr = lj_ir_call(J, IRCALL_fputc, tr, fp);
      if (results_wanted(J) != 0)  /* Check result only if not ignored. */
	emitir(IRTGI(IR_NE), tr, lj_ir_kint(J, -1));
    } else {
      TRef tr = lj_ir_call(J, IRCALL_fwrite, buf, one, len, fp);
      if (results_wanted(J) != 0)  /* Check result only if not ignored. */
	emitir(IRTGI(IR_EQ), tr, len);
    }
  }
  J->base[0] = LJ_52 ? ud : TREF_TRUE;
}